

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_base.h
# Opt level: O0

void __thiscall
alex::ExpectedIterationsAndShiftsAccumulator::ExpectedIterationsAndShiftsAccumulator
          (ExpectedIterationsAndShiftsAccumulator *this,int data_capacity)

{
  undefined4 in_ESI;
  StatAccumulator *in_RDI;
  
  StatAccumulator::StatAccumulator(in_RDI);
  in_RDI->_vptr_StatAccumulator =
       (_func_int **)&PTR__ExpectedIterationsAndShiftsAccumulator_00131d08;
  in_RDI[1]._vptr_StatAccumulator = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[2]._vptr_StatAccumulator = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[2]._vptr_StatAccumulator + 4) = 0;
  in_RDI[3]._vptr_StatAccumulator = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[4]._vptr_StatAccumulator = 0;
  *(undefined4 *)((long)&in_RDI[4]._vptr_StatAccumulator + 4) = in_ESI;
  return;
}

Assistant:

explicit ExpectedIterationsAndShiftsAccumulator(int data_capacity)
      : data_capacity_(data_capacity) {}